

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall
HighsSymmetryDetection::run(HighsSymmetryDetection *this,HighsSymmetries *symmetries)

{
  int iVar1;
  pointer puVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer piVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool bVar6;
  bool bVar7;
  HighsInt HVar8;
  int iVar9;
  uint uVar10;
  undefined8 *puVar11;
  long lVar12;
  HighsSymmetries *pHVar13;
  HighsSymmetries *pHVar14;
  pointer piVar15;
  int iVar16;
  bool bVar17;
  HighsInt *pHVar18;
  long lVar19;
  int iVar20;
  KeyType_conflict *key;
  ulong uVar21;
  ulong uVar22;
  pointer piVar23;
  pointer piVar24;
  u8 meta_1;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  HighsInt wrongCell;
  ComponentData componentData;
  int local_1e0;
  u8 local_1d9;
  HighsSymmetries *local_1d8;
  int local_1cc;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_1c8;
  vector<int,std::allocator<int>> *local_1c0;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *local_1b8;
  vector<int,_std::allocator<int>_> *local_1b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a0;
  u64 local_198;
  u64 local_190;
  u64 local_188;
  vector<int,_std::allocator<int>_> *local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_178;
  vector<int,_std::allocator<int>_> *local_170;
  HighsSplitDeque *local_168;
  HighsHashTable<int,_void> local_160;
  ComponentData local_138;
  
  initializeGroundSet(this);
  puVar2 = (this->currNodeCertificate).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->currNodeCertificate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  piVar23 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar23) {
    (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar23;
  }
  createNode(this);
  local_1cc = (int)(64000000 / (long)this->numActiveCols);
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  local_1a0 = &this->currNodeCertificate;
  puVar11 = (undefined8 *)__tls_get_addr(&PTR_00449ef0);
  local_168 = (HighsSplitDeque *)*puVar11;
  local_170 = &this->firstLeavePartition;
  local_1a8 = &this->bestLeaveCertificate;
  local_1b8 = &this->bestLeaveGraph;
  local_1b0 = &this->currentPartition;
  local_180 = &this->bestLeavePartition;
  local_1c8 = &this->firstLeaveGraph;
  local_1c0 = (vector<int,std::allocator<int>> *)&symmetries->permutations;
  local_178 = &this->firstLeaveCertificate;
  local_1d8 = symmetries;
  do {
    pNVar3 = (this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar4 = (this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar3 == pNVar4) break;
    HVar8 = selectTargetCell(this);
    if (HVar8 == -1) {
      if ((this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::operator=(local_170,local_1b0);
        __x = local_1a0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_178,local_1a0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1a8,__x);
        dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,this
                        );
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                  (local_1c8,(HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138)
        ;
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                  ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
        puVar2 = (this->currNodeCertificate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pNVar3 = (this->nodeStack).
                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = (long)(this->nodeStack).
                       super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3;
        uVar21 = uVar22 >> 4;
        iVar20 = (int)uVar21;
        this->firstPathDepth = iVar20;
        this->bestPathDepth = iVar20;
        HVar8 = (HighsInt)
                ((ulong)((long)puVar2 -
                        (long)(this->currNodeCertificate).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
        this->firstLeavePrefixLen = HVar8;
        iVar9 = 1;
        if (iVar20 < 1) {
          iVar9 = iVar20;
        }
        this->bestLeavePrefixLen = HVar8;
        pHVar18 = (HighsInt *)((long)pNVar3 + ((uVar22 & 0xffffffff0) - 0x18));
        do {
          uVar10 = iVar9 - 1;
          if ((int)uVar21 < 2) break;
          bVar6 = isFromBinaryColumn(this,*pHVar18);
          pHVar18 = pHVar18 + -4;
          uVar10 = (int)uVar21 - 1;
          uVar21 = (ulong)uVar10;
        } while (!bVar6);
        switchToNextNode(this,uVar10);
LAB_0030274c:
        HighsSplitDeque::checkInterrupt(local_168);
        goto LAB_00302759;
      }
      local_160.entries._M_t.
      super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
      .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = -1;
      uVar22 = (ulong)((long)pNVar4 - (long)pNVar3) >> 4;
      iVar20 = (int)uVar22 + -1;
      iVar16 = (int)((ulong)((long)(this->currNodeCertificate).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->currNodeCertificate).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar9 = iVar20;
      if (this->firstLeavePrefixLen == iVar16) {
LAB_0030223c:
        bVar6 = compareCurrentGraph(this,local_1c8,(HighsInt *)&local_160);
        if (bVar6) {
          uVar10 = this->numAutomorphisms;
          this->numAutomorphisms = uVar10 + 1;
          piVar23 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)((uVar10 & 0x3f) * this->numVertices);
          if (0 < this->numVertices) {
            piVar15 = (this->firstLeavePartition).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            piVar24 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start;
            piVar5 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = 0;
            do {
              piVar23[piVar5[piVar24[lVar12]]] = piVar15[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 < this->numVertices);
          }
          if (this->numVertices < 1) {
LAB_0030269f:
            iVar9 = this->firstPathDepth;
            goto LAB_003026a5;
          }
          lVar12 = 0;
          bVar6 = false;
          do {
            bVar7 = mergeOrbits(this,piVar23[lVar12],
                                (this->vertexGroundSet).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar12]);
            pHVar14 = local_1d8;
            bVar17 = bVar6;
            if (lVar12 < this->numActiveCols) {
              bVar17 = true;
            }
            if (!bVar7) {
              bVar17 = bVar6;
            }
            lVar12 = lVar12 + 1;
            bVar6 = bVar17;
          } while (lVar12 < this->numVertices);
          if (!bVar17) goto LAB_0030269f;
          std::vector<int,std::allocator<int>>::_M_range_insert<int*>
                    (local_1c0,
                     (local_1d8->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_finish,piVar23);
          iVar9 = pHVar14->numPerms + 1;
          pHVar14->numPerms = iVar9;
          if (iVar9 != local_1cc) goto LAB_0030269f;
LAB_00302351:
          iVar16 = 3;
          bVar6 = false;
        }
        else {
LAB_0030249a:
          if ((((this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) ||
              (this->bestLeavePrefixLen !=
               (int)((ulong)((long)(this->currNodeCertificate).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->currNodeCertificate).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2))) ||
             (bVar6 = compareCurrentGraph(this,local_1b8,(HighsInt *)&local_160), !bVar6)) {
            iVar16 = this->bestLeavePrefixLen;
            puVar2 = (this->currNodeCertificate).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((iVar16 < (int)((ulong)((long)(this->currNodeCertificate).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)puVar2) >> 2)) &&
               ((this->bestLeaveCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar16] < puVar2[iVar16])) {
              iVar9 = this->firstPathDepth + -2;
              pHVar18 = &(this->nodeStack).
                         super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->firstPathDepth + -1].
                         certificateEnd;
              do {
                iVar9 = iVar9 + 1;
                iVar1 = *pHVar18;
                pHVar18 = pHVar18 + 4;
              } while (iVar1 <= iVar16);
              if (iVar20 < iVar9) {
                iVar9 = iVar20;
              }
            }
            else if (-1 < iVar20) {
              do {
                uVar10 = (int)uVar22 - 1;
                if ((this->nodeStack).
                    super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].targetCell ==
                    (int)local_160.entries._M_t.
                         super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                         .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                         _M_head_impl) {
                  iVar9 = (int)uVar22 + -1;
                  break;
                }
                uVar22 = (ulong)uVar10;
              } while (0 < (int)uVar10);
            }
            goto LAB_0030273b;
          }
          uVar10 = this->numAutomorphisms;
          this->numAutomorphisms = uVar10 + 1;
          piVar23 = (this->automorphisms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)((uVar10 & 0x3f) * this->numVertices);
          if (0 < this->numVertices) {
            piVar15 = (this->bestLeavePartition).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            piVar24 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start;
            piVar5 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = 0;
            do {
              piVar23[piVar5[piVar24[lVar12]]] = piVar15[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 < this->numVertices);
          }
          if (0 < this->numVertices) {
            lVar12 = 0;
            bVar6 = false;
            do {
              bVar7 = mergeOrbits(this,piVar23[lVar12],
                                  (this->vertexGroundSet).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar12]);
              pHVar14 = local_1d8;
              bVar17 = bVar6;
              if (lVar12 < this->numActiveCols) {
                bVar17 = true;
              }
              if (!bVar7) {
                bVar17 = bVar6;
              }
              lVar12 = lVar12 + 1;
              bVar6 = bVar17;
            } while (lVar12 < this->numVertices);
            if (bVar17) {
              std::vector<int,std::allocator<int>>::_M_range_insert<int*>
                        (local_1c0,
                         (local_1d8->permutations).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,piVar23);
              iVar9 = pHVar14->numPerms + 1;
              pHVar14->numPerms = iVar9;
              if (iVar9 == local_1cc) goto LAB_00302351;
            }
          }
          iVar9 = this->bestPathDepth;
LAB_003026a5:
          if (iVar9 < iVar20) {
            iVar20 = iVar9;
          }
          iVar16 = 0;
          bVar6 = true;
        }
        iVar9 = iVar20;
        if (bVar6) goto LAB_0030273b;
      }
      else {
        if (this->bestLeavePrefixLen == iVar16) {
          if (this->firstLeavePrefixLen == iVar16) goto LAB_0030223c;
          goto LAB_0030249a;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(local_1a8,local_1a0);
        dumpCurrentGraph((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138,this
                        );
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::operator=
                  (local_1b8,(HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138)
        ;
        HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::~HighsHashTable
                  ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&local_138);
        std::vector<int,_std::allocator<int>_>::operator=(local_180,local_1b0);
        puVar2 = (this->currNodeCertificate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        this->bestPathDepth =
             (HighsInt)
             ((ulong)((long)(this->nodeStack).
                            super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodeStack).
                           super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
        this->bestLeavePrefixLen =
             (HighsInt)
             ((ulong)((long)puVar2 -
                     (long)(this->currNodeCertificate).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
LAB_0030273b:
        switchToNextNode(this,iVar9);
        iVar16 = 0;
      }
      if (iVar16 == 0) goto LAB_0030274c;
    }
    else {
      pNVar4[-1].targetCell = HVar8;
      determineNextToDistinguish(this);
      bVar6 = distinguishVertex(this,HVar8);
      if (bVar6) {
        bVar6 = partitionRefinement(this);
        if (!bVar6) {
          HVar8 = (HighsInt)
                  ((ulong)((long)(this->nodeStack).
                                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->nodeStack).
                                super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
          goto LAB_00302385;
        }
        createNode(this);
        iVar16 = 0;
        bVar6 = true;
      }
      else {
        HVar8 = (int)((ulong)((long)(this->nodeStack).
                                    super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodeStack).
                                   super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
LAB_00302385:
        switchToNextNode(this,HVar8);
        iVar16 = 2;
        bVar6 = false;
      }
      if (bVar6) {
LAB_00302759:
        iVar16 = 0;
      }
    }
  } while (iVar16 != 3);
  pHVar14 = local_1d8;
  local_1d8->numGenerators = local_1d8->numPerms;
  if (0 < local_1d8->numPerms) {
    std::vector<int,_std::allocator<int>_>::resize(&this->vertexPosition,(long)this->numCol);
    computeComponentData(&local_138,this,pHVar14);
    uVar10 = (int)((ulong)((long)local_138.componentStarts.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_138.componentStarts.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) - 1;
    if (0 < (int)uVar10) {
      uVar22 = 0;
      do {
        if (local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22 + 1] -
            local_138.componentStarts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22] != 1) {
          isFullOrbitope(this,&local_138,(HighsInt)uVar22,pHVar14);
        }
        uVar22 = uVar22 + 1;
      } while (uVar10 != uVar22);
    }
    local_1c8 = (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)&this->vertexPosition;
    HighsHashTable<int,_void>::HighsHashTable(&local_160);
    local_1e0 = 0;
    pHVar13 = pHVar14;
    if (0 < pHVar14->numPerms) {
      do {
        if (0 < this->numActiveCols) {
          key = (local_1d8->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + this->numActiveCols * local_1e0;
          lVar12 = 0;
          do {
            if ((*key != (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar12]) &&
               (bVar6 = HighsHashTable<int,_int>::findPosition
                                  (&pHVar14->columnToOrbitope,key,&local_1d9,&local_190,&local_198,
                                   &local_188), bVar6)) {
              HighsHashTable<int,void>::insert<int&>
                        ((HighsHashTable<int,void> *)&local_160,&local_1e0);
              break;
            }
            lVar12 = lVar12 + 1;
            key = key + 1;
          } while (lVar12 < this->numActiveCols);
        }
        local_1e0 = local_1e0 + 1;
        pHVar13 = local_1d8;
      } while (local_1e0 < local_1d8->numPerms);
    }
    iVar9 = this->numActiveCols;
    if (iVar9 < 1) {
      iVar20 = 0;
      pHVar14 = pHVar13;
    }
    else {
      lVar19 = 0;
      lVar12 = 0;
      iVar20 = 0;
      do {
        HVar8 = getOrbit(this,*(HighsInt *)
                               ((long)(this->vertexGroundSet).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar19));
        if (((this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[HVar8] == 1) ||
           (bVar6 = HighsHashTable<int,_int>::findPosition
                              (&pHVar13->columnToOrbitope,
                               (KeyType_conflict *)
                               ((long)(this->vertexGroundSet).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar19),(u8 *)&local_1e0,
                               &local_190,&local_198,&local_188), bVar6)) {
          piVar23 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)piVar23 + lVar19)] = -1;
          *(undefined4 *)((long)piVar23 + lVar19) = 0xffffffff;
          iVar20 = iVar20 + 1;
        }
        lVar12 = lVar12 + 1;
        iVar9 = this->numActiveCols;
        lVar19 = lVar19 + 4;
        pHVar14 = local_1d8;
      } while (lVar12 < iVar9);
    }
    if (iVar20 != 0) {
      local_1e0 = 0;
      lVar12 = (long)iVar9 * (long)pHVar14->numPerms;
      if ((int)lVar12 != 0) {
        piVar15 = (local_1d8->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar24 = piVar15 + lVar12;
        piVar23 = piVar15;
        do {
          bVar6 = HighsHashTable<int,_void>::findPosition
                            (&local_160,&local_1e0,&local_1d9,&local_190,&local_198,&local_188);
          if (bVar6 && CONCAT44(local_160.entries._M_t.
                                super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>.
                                _M_head_impl._4_4_,
                                (int)local_160.entries._M_t.
                                     super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>
                                     .super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>
                                     ._M_head_impl) != 0) {
            local_1d8->numPerms = local_1d8->numPerms + -1;
          }
          else if (0 < this->numActiveCols) {
            piVar5 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = 0;
            do {
              if (piVar5[lVar12] != -1) {
                *piVar15 = piVar23[lVar12];
                piVar15 = piVar15 + 1;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < this->numActiveCols);
          }
          piVar23 = piVar23 + this->numActiveCols;
          local_1e0 = local_1e0 + 1;
        } while (piVar23 != piVar24);
      }
      iVar9 = this->numActiveCols;
      if (0 < iVar9) {
        piVar23 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar15 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar12 = 0;
        iVar16 = 0;
        do {
          iVar9 = piVar15[lVar12];
          if ((long)iVar9 != -1) {
            piVar15[iVar16] = iVar9;
            piVar23[iVar9] = iVar16;
            iVar16 = iVar16 + 1;
          }
          lVar12 = lVar12 + 1;
          iVar9 = this->numActiveCols;
        } while (lVar12 < iVar9);
      }
      this->numActiveCols = iVar9 - iVar20;
      pHVar14 = local_1d8;
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->vertexGroundSet,(long)this->numActiveCols)
    ;
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&pHVar14->permutationColumns,&this->vertexGroundSet);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&pHVar14->columnPosition,local_1c8);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_1c0,
               (long)this->numActiveCols * (long)pHVar14->numPerms);
    HighsHashTable<int,_void>::~HighsHashTable(&local_160);
    ComponentData::~ComponentData(&local_138);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::run(HighsSymmetries& symmetries) {
  assert(numActiveCols != 0);
  initializeGroundSet();
  currNodeCertificate.clear();
  cellCreationStack.clear();
  createNode();
  HighsInt maxPerms = 64000000 / numActiveCols;
  HighsSplitDeque* workerDeque = HighsTaskExecutor::getThisWorkerDeque();
  while (!nodeStack.empty()) {
    HighsInt targetCell = selectTargetCell();
    if (targetCell == -1) {
      if (firstLeavePartition.empty()) {
        firstLeavePartition = currentPartition;
        firstLeaveCertificate = currNodeCertificate;
        bestLeaveCertificate = currNodeCertificate;
        firstLeaveGraph = dumpCurrentGraph();
        firstPathDepth = nodeStack.size();
        bestPathDepth = nodeStack.size();
        firstLeavePrefixLen = currNodeCertificate.size();
        bestLeavePrefixLen = currNodeCertificate.size();

        HighsInt backtrackDepth = firstPathDepth - 1;
        while (backtrackDepth > 0 &&
               !isFromBinaryColumn(nodeStack[backtrackDepth - 1].targetCell))
          --backtrackDepth;
        switchToNextNode(backtrackDepth);
      } else {
        HighsInt wrongCell = -1;
        HighsInt backtrackDepth = nodeStack.size() - 1;
        assert(currNodeCertificate.size() == firstLeaveCertificate.size());
        if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() ||
            bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) {
          if (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size() &&
              compareCurrentGraph(firstLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt firstLeaveCol = firstLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = firstLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }
            backtrackDepth = std::min(backtrackDepth, firstPathDepth);
          } else if (!bestLeavePartition.empty() &&
                     bestLeavePrefixLen ==
                         (HighsInt)currNodeCertificate.size() &&
                     compareCurrentGraph(bestLeaveGraph, wrongCell)) {
            HighsInt k = (numAutomorphisms++) & 63;
            HighsInt* permutation = automorphisms.data() + k * numVertices;
            for (HighsInt i = 0; i < numVertices; ++i) {
              HighsInt bestLeaveCol = bestLeavePartition[i];
              permutation[vertexPosition[currentPartition[i]]] = bestLeaveCol;
            }

            bool report = false;
            for (HighsInt i = 0; i < numVertices; ++i) {
              if (mergeOrbits(permutation[i], vertexGroundSet[i]) &&
                  i < numActiveCols) {
                assert(permutation[i] < numCol);
                report = true;
              }
            }

            if (report) {
              symmetries.permutations.insert(symmetries.permutations.end(),
                                             permutation,
                                             permutation + numActiveCols);
              ++symmetries.numPerms;
              if (symmetries.numPerms == maxPerms) break;
            }

            backtrackDepth = std::min(backtrackDepth, bestPathDepth);
          } else if (bestLeavePrefixLen <
                         (HighsInt)currNodeCertificate.size() &&
                     currNodeCertificate[bestLeavePrefixLen] >
                         bestLeaveCertificate[bestLeavePrefixLen]) {
            // certificate value is lexicographically above the smallest one
            // seen so far, so we might be able to backtrack to a higher level
            HighsInt possibleBacktrackDepth = firstPathDepth - 1;
            while (nodeStack[possibleBacktrackDepth].certificateEnd <=
                   bestLeavePrefixLen)
              ++possibleBacktrackDepth;

            backtrackDepth = std::min(possibleBacktrackDepth, backtrackDepth);
          } else {
            // This case can be caused by a hash collision which was now
            // detected in the graph comparison call. The graph comparison call
            // will return the cell where the vertex neighbourhood caused a
            // mismatch on the edges. This would have been detected by
            // an exact partition refinement when we targeted that cell the last
            // time, so that is where we can backtrack to.
            HighsInt possibleBacktrackDepth;
            for (possibleBacktrackDepth = backtrackDepth;
                 possibleBacktrackDepth >= 0; --possibleBacktrackDepth) {
              if (nodeStack[possibleBacktrackDepth].targetCell == wrongCell) {
                backtrackDepth = possibleBacktrackDepth;
                break;
              }
            }
          }
        } else {
          // leave must have a lexicographically smaller certificate value
          // than the current best leave, because its prefix length is smaller
          // than the best leaves and it would have been already pruned if
          // it's certificate value was larger unless it is equal to the first
          // leaf nodes certificate value which is caught by the first case
          // of the if condition. Hence, having a lexicographically smaller
          // certificate value than the best leave is the only way to get
          // here.
          assert(bestLeaveCertificate[bestLeavePrefixLen] >
                     currNodeCertificate[bestLeavePrefixLen] &&
                 std::memcmp(bestLeaveCertificate.data(),
                             currNodeCertificate.data(),
                             bestLeavePrefixLen * sizeof(u32)) == 0);
          bestLeaveCertificate = currNodeCertificate;
          bestLeaveGraph = dumpCurrentGraph();
          bestLeavePartition = currentPartition;
          bestPathDepth = nodeStack.size();
          bestLeavePrefixLen = currNodeCertificate.size();
        }

        switchToNextNode(backtrackDepth);
      }

      workerDeque->checkInterrupt();
    } else {
      Node& currNode = nodeStack.back();
      currNode.targetCell = targetCell;
      bool success = determineNextToDistinguish();
      assert(success);
      if (!distinguishVertex(targetCell)) {
        switchToNextNode(nodeStack.size() - 1);
        continue;
      }
      if (!partitionRefinement()) {
        switchToNextNode(nodeStack.size());
        continue;
      }

      createNode();
    }
  }

  symmetries.numGenerators = symmetries.numPerms;
  if (symmetries.numPerms > 0) {
    vertexPosition.resize(numCol);

    ComponentData componentData = computeComponentData(symmetries);
    HighsInt numComponents = componentData.numComponents();

    for (HighsInt i = 0; i < numComponents; ++i) {
      if (componentData.componentSize(i) == 1) continue;

      isFullOrbitope(componentData, i, symmetries);
    }

    HighsHashTable<HighsInt> deletedPerms;
    for (HighsInt p = 0; p < symmetries.numPerms; ++p) {
      HighsInt* perm = symmetries.permutations.data() + p * numActiveCols;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (perm[i] != vertexGroundSet[i] &&
            symmetries.columnToOrbitope.find(perm[i])) {
          deletedPerms.insert(p);
          break;
        }
      }
    }

    // check which columns have non-trivial orbits
    HighsInt numFixed = 0;
    for (HighsInt i = 0; i < numActiveCols; ++i) {
      if (orbitSize[getOrbit(vertexGroundSet[i])] == 1 ||
          symmetries.columnToOrbitope.find(vertexGroundSet[i])) {
        vertexPosition[vertexGroundSet[i]] = -1;
        vertexGroundSet[i] = -1;
        numFixed += 1;
      }
    }

    if (numFixed != 0) {
      // now compress symmetries and the groundset to only contain the unfixed
      // columns and columns not handled by full orbitopes
      HighsInt p = 0;
      HighsInt* perms = symmetries.permutations.data();
      HighsInt* permEnd =
          symmetries.permutations.data() + symmetries.numPerms * numActiveCols;
      HighsInt* permOutput = symmetries.permutations.data();
      while (perms != permEnd) {
        if (!deletedPerms.find(p)) {
          for (HighsInt i = 0; i < numActiveCols; ++i) {
            if (vertexGroundSet[i] == -1) continue;

            *permOutput = perms[i];
            ++permOutput;
          }
        } else {
          --symmetries.numPerms;
        }
        perms += numActiveCols;
        ++p;
      }

      HighsInt outPos = 0;
      for (HighsInt i = 0; i < numActiveCols; ++i) {
        if (vertexGroundSet[i] == -1) continue;

        vertexGroundSet[outPos] = vertexGroundSet[i];
        vertexPosition[vertexGroundSet[outPos]] = outPos;
        outPos += 1;
      }

      numActiveCols -= numFixed;
      assert(permOutput == symmetries.permutations.data() +
                               symmetries.numPerms * numActiveCols);
    }

    vertexGroundSet.resize(numActiveCols);
    symmetries.permutationColumns = std::move(vertexGroundSet);
    symmetries.columnPosition = std::move(vertexPosition);
    symmetries.permutations.resize(symmetries.numPerms * numActiveCols);
  }
}